

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_uncompress_block(cram_block *b)

{
  uint uVar1;
  size_t sVar2;
  uchar *puVar3;
  char *__ptr;
  size_t sStack_40;
  uint usize2;
  size_t uncomp_size;
  
  uncomp_size = 0;
  uVar1 = b->uncomp_size;
  if (uVar1 == 0) {
LAB_00124e59:
    b->method = RAW;
    return 0;
  }
  switch(b->method) {
  case RAW:
    return b->method;
  case GZIP:
    puVar3 = (uchar *)zlib_mem_inflate((char *)b->data,(long)b->comp_size,&uncomp_size);
    sVar2 = uncomp_size;
    if (puVar3 == (uchar *)0x0) {
      return -1;
    }
    if (b->uncomp_size != (int)uncomp_size) {
      free(puVar3);
      return -1;
    }
    free(b->data);
    b->data = puVar3;
    b->alloc = sVar2;
    goto LAB_00124e59;
  case BZIP2:
    __ptr = "Bzip2 compression is not compiled into this version.\nPlease rebuild and try again.\n";
    sStack_40 = 0x53;
    break;
  case LZMA:
    __ptr = "Lzma compression is not compiled into this version.\nPlease rebuild and try again.\n";
    sStack_40 = 0x52;
    break;
  case RANS:
    puVar3 = rans_uncompress(b->data,b->comp_size,&usize2);
    if (uVar1 == usize2) {
      free(b->data);
      b->data = puVar3;
      b->alloc = (ulong)usize2;
      b->method = RAW;
      b->uncomp_size = usize2;
      return 0;
    }
    __assert_fail("usize == usize2",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                  ,0x3cb,"int cram_uncompress_block(cram_block *)");
  default:
    goto switchD_00124e19_default;
  }
  fwrite(__ptr,sStack_40,1,_stderr);
switchD_00124e19_default:
  return -1;
}

Assistant:

int cram_uncompress_block(cram_block *b) {
    char *uncomp;
    size_t uncomp_size = 0;

    if (b->uncomp_size == 0) {
	// blank block
	b->method = RAW;
	return 0;
    }

    switch (b->method) {
    case RAW:
	return 0;

    case GZIP:
	uncomp = zlib_mem_inflate((char *)b->data, b->comp_size, &uncomp_size);
	if (!uncomp)
	    return -1;
	if ((int)uncomp_size != b->uncomp_size) {
	    free(uncomp);
	    return -1;
	}
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = uncomp_size;
	b->method = RAW;
	break;

#ifdef HAVE_LIBBZ2
    case BZIP2: {
	unsigned int usize = b->uncomp_size;
	if (!(uncomp = malloc(usize)))
	    return -1;
	if (BZ_OK != BZ2_bzBuffToBuffDecompress(uncomp, &usize,
						(char *)b->data, b->comp_size,
						0, 0)) {
	    free(uncomp);
	    return -1;
	}
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = usize;
	b->method = RAW;
	b->uncomp_size = usize; // Just incase it differs
	break;
    }
#else
    case BZIP2:
	fprintf(stderr, "Bzip2 compression is not compiled into this "
		"version.\nPlease rebuild and try again.\n");
	return -1;
#endif

#ifdef HAVE_LIBLZMA
    case LZMA:
	uncomp = lzma_mem_inflate((char *)b->data, b->comp_size, &uncomp_size);
	if (!uncomp)
	    return -1;
	if ((int)uncomp_size != b->uncomp_size)
	    return -1;
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = uncomp_size;
	b->method = RAW;
	break;
#else
    case LZMA:
	fprintf(stderr, "Lzma compression is not compiled into this "
		"version.\nPlease rebuild and try again.\n");
	return -1;
	break;
#endif

    case RANS: {
	unsigned int usize = b->uncomp_size, usize2;
	uncomp = (char *)rans_uncompress(b->data, b->comp_size, &usize2);
	assert(usize == usize2);
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = usize2;
	b->method = RAW;
	b->uncomp_size = usize2; // Just incase it differs
	//fprintf(stderr, "Expanded %d to %d\n", b->comp_size, b->uncomp_size);
	break;
    }

    default:
	return -1;
    }

    return 0;
}